

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddNeg.c
# Opt level: O2

DdNode * cuddAddRoundOffRecur(DdManager *dd,DdNode *f,double trunc)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *data;
  double dVar3;
  
  if (f->index == 0x7fffffff) {
    dVar3 = ceil((f->type).value * trunc);
    pDVar2 = cuddUniqueConst(dd,dVar3 / trunc);
    return pDVar2;
  }
  pDVar2 = cuddCacheLookup1(dd,Cudd_addRoundOff,f);
  if (pDVar2 == (DdNode *)0x0) {
    pDVar2 = (f->type).kids.E;
    T = cuddAddRoundOffRecur(dd,(f->type).kids.T,trunc);
    if (T != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar2 = cuddAddRoundOffRecur(dd,pDVar2,trunc);
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = T;
        if ((T == pDVar2) || (data = cuddUniqueInter(dd,f->index,T,pDVar2), data != (DdNode *)0x0))
        {
          piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert1(dd,Cudd_addRoundOff,f,data);
          return data;
        }
        Cudd_RecursiveDeref(dd,T);
        T = pDVar2;
      }
      Cudd_RecursiveDeref(dd,T);
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddRoundOffRecur(
  DdManager * dd,
  DdNode * f,
  double  trunc)
{

    DdNode *res, *fv, *fvn, *T, *E;
    double n;
    DD_CTFP1 cacheOp;

    statLine(dd);
    if (cuddIsConstant(f)) {
        n = ceil(cuddV(f)*trunc)/trunc;
        res = cuddUniqueConst(dd,n);
        return(res);
    }
    cacheOp = (DD_CTFP1) Cudd_addRoundOff;
    res = cuddCacheLookup1(dd,cacheOp,f);
    if (res != NULL) {
        return(res);
    }
    /* Recursive Step */
    fv = cuddT(f);
    fvn = cuddE(f);
    T = cuddAddRoundOffRecur(dd,fv,trunc);
    if (T == NULL) {
       return(NULL);
    }
    cuddRef(T);
    E = cuddAddRoundOffRecur(dd,fvn,trunc);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = (T == E) ? T : cuddUniqueInter(dd,(int)f->index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,cacheOp,f,res);
    return(res);

}